

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

void __thiscall
perfetto::protos::gen::TraceStats_BufferStats::~TraceStats_BufferStats(TraceStats_BufferStats *this)

{
  (this->super_CppMessageObj)._vptr_CppMessageObj =
       (_func_int **)&PTR__TraceStats_BufferStats_00407178;
  ::std::__cxx11::string::~string((string *)&this->unknown_fields_);
  return;
}

Assistant:

TraceStats_BufferStats::~TraceStats_BufferStats() = default;